

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Request * __thiscall
kj::anon_unknown_31::ConcurrencyLimitingHttpClient::request
          (Request *__return_storage_ptr__,ConcurrencyLimitingHttpClient *this,HttpMethod method,
          StringPtr url,HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  PromiseNode *pPVar1;
  PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *pPVar2;
  char *pcVar3;
  TransformPromiseNodeBase *this_00;
  int __flags;
  Maybe<unsigned_long> *pMVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  Disposer *pDVar5;
  void *pvVar6;
  void *__arg;
  size_t sVar7;
  Promise<kj::HttpClient::Response> PVar8;
  Own<kj::(anonymous_namespace)::PromiseOutputStream> OVar9;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:3979:15),_kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  combined;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  paf;
  String urlCopy;
  SplitTuplePromise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
  split;
  HttpHeaders headersCopy;
  Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
  local_1a8;
  Own<kj::_::PromiseNode> local_198;
  value_type local_188;
  String local_178;
  SplitTuplePromise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
  local_158;
  ArrayDisposer *pAStack_138;
  HttpHeaders HStack_130;
  char local_d0;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_c8;
  char local_b8 [8];
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_b0;
  undefined1 local_a8 [16];
  size_t local_98;
  ArrayDisposer *local_90;
  Header *pHStack_88;
  RemoveConst<kj::HttpHeaders::Header> *local_80;
  Header *pHStack_78;
  _Elt_pointer local_70;
  Array<char> *pAStack_68;
  RemoveConst<kj::Array<char>_> *local_60;
  Array<char> *pAStack_58;
  _Elt_pointer local_50;
  _Elt_pointer local_48;
  _Elt_pointer pOStack_40;
  
  pvVar6 = (void *)url.content.size_;
  if (this->concurrentRequests < this->maxConcurrentRequests) {
    this->concurrentRequests = this->concurrentRequests + 1;
    local_b8[0] = (expectedBodySize->ptr).isSet;
    if ((bool)local_b8[0] == true) {
      local_b0 = (expectedBodySize->ptr).field_1;
    }
    local_198.disposer = (Disposer *)this;
    (**this->inner->_vptr_HttpClient)
              (&local_158,this->inner,(ulong)method,url.content.ptr,pvVar6,headers,local_b8);
    fireCountChanged(this);
    PVar8 = attachCounter((ConcurrencyLimitingHttpClient *)local_a8,
                          &local_158.impl.
                           super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value,
                          (ConnectionCounter *)&local_198);
    pPVar1 = local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
             super_PromiseBase.node.ptr;
    (__return_storage_ptr__->body).disposer =
         local_158.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
         super_PromiseBase.node.disposer;
    (__return_storage_ptr__->body).ptr =
         (AsyncOutputStream *)
         local_158.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
         super_PromiseBase.node.ptr;
    local_158.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
    super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    *(undefined4 *)&(__return_storage_ptr__->response).super_PromiseBase.node.disposer =
         local_a8._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->response).super_PromiseBase.node.disposer + 4) =
         local_a8._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->response).super_PromiseBase.node.ptr = local_a8._8_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->response).super_PromiseBase.node.ptr + 4) =
         local_a8._12_4_;
    if (local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
        super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
      local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
      super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
          super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value
                 .super_PromiseBase.node.disposer,
                 pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode,
                 PVar8.super_PromiseBase.node.ptr);
      pPVar1 = local_158.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.
               value.super_PromiseBase.node.ptr;
      if (local_158.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value
          .super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
        local_158.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
        super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        (**(local_158.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.
            value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                  (local_158.impl.
                   super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
                   super_PromiseBase.node.disposer,
                   pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
      }
    }
    ConnectionCounter::~ConnectionCounter((ConnectionCounter *)&local_198);
  }
  else {
    pMVar4 = expectedBodySize;
    __arg = pvVar6;
    newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
              ();
    __flags = (int)pMVar4;
    sVar7 = (long)pvVar6 - 1;
    heapString(&local_178,sVar7);
    pvVar6 = extraout_RDX;
    if (sVar7 != 0) {
      pDVar5 = (Disposer *)local_178.content.size_;
      if ((Disposer *)local_178.content.size_ != (Disposer *)0x0) {
        pDVar5 = (Disposer *)local_178.content.ptr;
      }
      memcpy(pDVar5,url.content.ptr,sVar7);
      pvVar6 = extraout_RDX_00;
    }
    HttpHeaders::clone((HttpHeaders *)local_a8,(__fn *)headers,pvVar6,__flags,__arg);
    local_158.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
    super_PromiseBase.node.ptr =
         (PromiseNode *)
         CONCAT44(local_158.impl.
                  super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
                  super_PromiseBase.node.ptr._4_4_,method);
    local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
    super_PromiseBase.node.disposer = (Disposer *)local_178.content.ptr;
    local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
    super_PromiseBase.node.ptr = (PromiseNode *)local_178.content.size_;
    pAStack_138 = local_178.content.disposer;
    local_178.content.ptr = (char *)0x0;
    local_178.content.size_ = 0;
    HStack_130.table = (HttpHeaderTable *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
    HStack_130.indexedHeaders.ptr = (StringPtr *)local_a8._8_8_;
    HStack_130.indexedHeaders.size_ = local_98;
    local_a8._8_8_ = (StringPtr *)0x0;
    local_98 = 0;
    HStack_130.indexedHeaders.disposer = local_90;
    HStack_130.unindexedHeaders.builder.ptr = pHStack_88;
    HStack_130.unindexedHeaders.builder.pos = local_80;
    HStack_130.unindexedHeaders.builder.endPtr = pHStack_78;
    pHStack_88 = (Header *)0x0;
    local_80 = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    pHStack_78 = (Header *)0x0;
    HStack_130.unindexedHeaders.builder.disposer = (ArrayDisposer *)local_70;
    HStack_130.ownedStrings.builder.ptr = pAStack_68;
    HStack_130.ownedStrings.builder.pos = local_60;
    HStack_130.ownedStrings.builder.endPtr = pAStack_58;
    HStack_130.ownedStrings.builder.disposer = (ArrayDisposer *)local_50;
    pAStack_68 = (Array<char> *)0x0;
    local_60 = (RemoveConst<kj::Array<char>_> *)0x0;
    pAStack_58 = (Array<char> *)0x0;
    local_d0 = (expectedBodySize->ptr).isSet;
    if ((bool)local_d0 == true) {
      local_c8 = (expectedBodySize->ptr).field_1;
    }
    local_158.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
    super_PromiseBase.node.disposer = (Disposer *)this;
    this_00 = (TransformPromiseNodeBase *)operator_new(0xc0);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_198,
               _::
               TransformPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>,_kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3979:15),_kj::_::PropagateException>
               ::anon_class_152_5_1d7fcda0_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_004458f0;
    this_00[1].super_PromiseNode._vptr_PromiseNode =
         (_func_int **)
         local_158.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
         super_PromiseBase.node.disposer;
    *(undefined4 *)&this_00[1].dependency.disposer =
         local_158.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
         super_PromiseBase.node.ptr._0_4_;
    this_00[1].dependency.ptr =
         (PromiseNode *)
         local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
         super_PromiseBase.node.disposer;
    this_00[1].continuationTracePtr =
         local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
         super_PromiseBase.node.ptr;
    local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
    super_PromiseBase.node.disposer = (Disposer *)0x0;
    local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
    super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    this_00[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)pAStack_138;
    this_00[2].dependency.disposer = (Disposer *)HStack_130.table;
    this_00[2].dependency.ptr = (PromiseNode *)HStack_130.indexedHeaders.ptr;
    this_00[2].continuationTracePtr = (void *)HStack_130.indexedHeaders.size_;
    HStack_130.indexedHeaders.ptr = (StringPtr *)0x0;
    HStack_130.indexedHeaders.size_ = 0;
    this_00[3].super_PromiseNode._vptr_PromiseNode =
         (_func_int **)HStack_130.indexedHeaders.disposer;
    this_00[3].dependency.disposer = (Disposer *)HStack_130.unindexedHeaders.builder.ptr;
    this_00[3].dependency.ptr = (PromiseNode *)HStack_130.unindexedHeaders.builder.pos;
    this_00[3].continuationTracePtr = HStack_130.unindexedHeaders.builder.endPtr;
    HStack_130.unindexedHeaders.builder.endPtr = (Header *)0x0;
    HStack_130.unindexedHeaders.builder.ptr = (Header *)0x0;
    HStack_130.unindexedHeaders.builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    this_00[4].super_PromiseNode._vptr_PromiseNode =
         (_func_int **)HStack_130.unindexedHeaders.builder.disposer;
    this_00[4].dependency.disposer = (Disposer *)HStack_130.ownedStrings.builder.ptr;
    this_00[4].dependency.ptr = (PromiseNode *)HStack_130.ownedStrings.builder.pos;
    this_00[4].continuationTracePtr = HStack_130.ownedStrings.builder.endPtr;
    this_00[5].super_PromiseNode._vptr_PromiseNode =
         (_func_int **)HStack_130.ownedStrings.builder.disposer;
    HStack_130.ownedStrings.builder.endPtr = (Array<char> *)0x0;
    HStack_130.ownedStrings.builder.ptr = (Array<char> *)0x0;
    HStack_130.ownedStrings.builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
    *(char *)&this_00[5].dependency.disposer = local_d0;
    if (local_d0 == '\x01') {
      this_00[5].dependency.ptr = (PromiseNode *)local_c8;
    }
    local_1a8.super_PromiseBase.node.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,kj::Promise<kj::HttpClient::Response>>,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)#1},kj::_::PropagateException>>
          ::instance;
    local_1a8.super_PromiseBase.node.ptr = (PromiseNode *)this_00;
    HttpHeaders::~HttpHeaders(&HStack_130);
    pPVar1 = local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
             super_PromiseBase.node.ptr;
    pDVar5 = local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
             super_PromiseBase.node.disposer;
    if (local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
        super_PromiseBase.node.disposer != (Disposer *)0x0) {
      local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
      super_PromiseBase.node.disposer = (Disposer *)0x0;
      local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
      super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**pAStack_138->_vptr_ArrayDisposer)(pAStack_138,pDVar5,1,pPVar1,pPVar1,0);
    }
    Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>::
    split(&local_158,&local_1a8);
    std::
    queue<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>,_std::deque<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>_>_>_>
    ::push(&this->pendingRequests,&local_188);
    fireCountChanged(this);
    OVar9 = heap<kj::(anonymous_namespace)::PromiseOutputStream,kj::Promise<kj::Own<kj::AsyncOutputStream>>>
                      ((kj *)&local_48,(Promise<kj::Own<kj::AsyncOutputStream>_> *)&local_158);
    pPVar1 = local_158.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.
             value.super_PromiseBase.node.ptr;
    (__return_storage_ptr__->body).disposer = (Disposer *)local_48;
    (__return_storage_ptr__->body).ptr = (AsyncOutputStream *)pOStack_40;
    *(undefined4 *)&(__return_storage_ptr__->response).super_PromiseBase.node.disposer =
         local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
         super_PromiseBase.node.disposer._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->response).super_PromiseBase.node.disposer + 4) =
         local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
         super_PromiseBase.node.disposer._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->response).super_PromiseBase.node.ptr =
         local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
         super_PromiseBase.node.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->response).super_PromiseBase.node.ptr + 4) =
         local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
         super_PromiseBase.node.ptr._4_4_;
    local_158.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
    super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    if (local_158.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
        super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
      local_158.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
      super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**((HttpClient *)
         &(local_158.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.
           value.super_PromiseBase.node.disposer)->_vptr_Disposer)->_vptr_HttpClient)
                (local_158.impl.
                 super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
                 super_PromiseBase.node.disposer,
                 pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode,OVar9.ptr);
    }
    pPVar1 = local_1a8.super_PromiseBase.node.ptr;
    if ((TransformPromiseNodeBase *)local_1a8.super_PromiseBase.node.ptr !=
        (TransformPromiseNodeBase *)0x0) {
      local_1a8.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_1a8.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_1a8.super_PromiseBase.node.disposer,
                 ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
    }
    HttpHeaders::~HttpHeaders((HttpHeaders *)local_a8);
    sVar7 = local_178.content.size_;
    pcVar3 = local_178.content.ptr;
    if (local_178.content.ptr != (char *)0x0) {
      local_178.content.ptr = (char *)0x0;
      local_178.content.size_ = 0;
      (**(local_178.content.disposer)->_vptr_ArrayDisposer)
                (local_178.content.disposer,pcVar3,1,sVar7,sVar7,0);
    }
    pPVar2 = local_188.ptr;
    if (local_188.ptr !=
        (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
         *)0x0) {
      local_188.ptr =
           (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
            *)0x0;
      (**(local_188.disposer)->_vptr_Disposer)
                (local_188.disposer,
                 pPVar2->_vptr_PromiseFulfiller[-2] + (long)&pPVar2->_vptr_PromiseFulfiller);
    }
    pPVar1 = local_198.ptr;
    if (local_198.ptr != (PromiseNode *)0x0) {
      local_198.ptr = (PromiseNode *)0x0;
      (**(local_198.disposer)->_vptr_Disposer)
                (local_198.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode
                );
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = nullptr) override {
    if (concurrentRequests < maxConcurrentRequests) {
      auto counter = ConnectionCounter(*this);
      auto request = inner.request(method, url, headers, expectedBodySize);
      fireCountChanged();
      auto promise = attachCounter(kj::mv(request.response), kj::mv(counter));
      return { kj::mv(request.body), kj::mv(promise) };
    }

    auto paf = kj::newPromiseAndFulfiller<ConnectionCounter>();
    auto urlCopy = kj::str(url);
    auto headersCopy = headers.clone();

    auto combined = paf.promise
        .then([this,
               method,
               urlCopy = kj::mv(urlCopy),
               headersCopy = kj::mv(headersCopy),
               expectedBodySize](ConnectionCounter&& counter) mutable {
      auto req = inner.request(method, urlCopy, headersCopy, expectedBodySize);
      return kj::tuple(kj::mv(req.body), attachCounter(kj::mv(req.response), kj::mv(counter)));
    });
    auto split = combined.split();
    pendingRequests.push(kj::mv(paf.fulfiller));
    fireCountChanged();
    return { kj::heap<PromiseOutputStream>(kj::mv(kj::get<0>(split))), kj::mv(kj::get<1>(split)) };
  }